

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O2

string * __thiscall
antlr::ANTLRException::toString_abi_cxx11_(string *__return_storage_ptr__,ANTLRException *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->text);
  return __return_storage_ptr__;
}

Assistant:

string toString() const
	{
		return text;
	}